

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O2

bool __thiscall
gss::innards::Lackey::reduce_initial_bounds(Lackey *this,RestrictRangeFunction *restrict_range)

{
  _Head_base<0UL,_gss::innards::Lackey::Imp_*,_false> _Var1;
  __type _Var2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  istream *piVar6;
  long *plVar7;
  void *this_00;
  DisobedientLackeyError *pDVar8;
  int i;
  int iVar9;
  int v;
  int __val;
  string_view n_00;
  int n;
  string k;
  anon_class_24_3_091e47fb delete_one;
  int upper;
  int lower;
  optional<int> p;
  string response;
  string operation;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RestrictRangeFunction *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  unique_lock<std::mutex> lock;
  
  local_68 = restrict_range;
  std::unique_lock<std::mutex>::unique_lock
            (&lock,&((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
                    external_solver_mutex);
  plVar7 = &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
             .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
            number_of_calls;
  *plVar7 = *plVar7 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command,"I",(allocator<char> *)&operation);
  poVar5 = std::operator<<((ostream *)
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl
                            )->send_to,(string *)&command);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
  std::endl<char,std::char_traits<char>>(poVar5);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  if ((*(byte *)((long)&(_Var1._M_head_impl)->field_0x48 +
                *(long *)(*(long *)&(_Var1._M_head_impl)->send_to + -0x18)) & 5) != 0) {
    pDVar8 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&operation,"error giving lackey its orders",(allocator<char> *)&response);
    DisobedientLackeyError::DisobedientLackeyError(pDVar8,&operation);
    __cxa_throw(pDVar8,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  operation._M_dataplus._M_p = (pointer)&operation.field_2;
  operation._M_string_length = 0;
  operation.field_2._M_local_buf[0] = '\0';
  piVar6 = std::operator>>((istream *)&(_Var1._M_head_impl)->read_from,(string *)&operation);
  if ((((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) &&
     (_Var2 = std::operator==(&operation,&command), _Var2)) {
    response._M_dataplus._M_p = (pointer)&response.field_2;
    response._M_string_length = 0;
    response.field_2._M_local_buf[0] = '\0';
    piVar6 = std::operator>>((istream *)
                             &((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                              _M_head_impl)->read_from,(string *)&response);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      pDVar8 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &delete_one,"asked lackey to ",&command);
      std::operator+(&k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &delete_one,", but it gave no T/F");
      DisobedientLackeyError::DisobedientLackeyError(pDVar8,&k);
      __cxa_throw(pDVar8,&DisobedientLackeyError::typeinfo,
                  DisobedientLackeyError::~DisobedientLackeyError);
    }
    bVar3 = std::operator==(&response,"T");
    if (bVar3) {
      plVar7 = (long *)std::istream::operator>>
                                 (&((this->_imp)._M_t.
                                    super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                    .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                   _M_head_impl)->read_from,&n);
      if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
        pDVar8 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&local_a8,n);
        std::operator+(&local_88,"lackey replied with length \'",&local_a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &local_88,"\' to ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &delete_one,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &command);
        std::operator+(&k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &delete_one," query");
        DisobedientLackeyError::DisobedientLackeyError(pDVar8,&k);
        __cxa_throw(pDVar8,&DisobedientLackeyError::typeinfo,
                    DisobedientLackeyError::~DisobedientLackeyError);
      }
      for (__val = 0; __val < n; __val = __val + 1) {
        k._M_string_length = 0;
        k.field_2._M_local_buf[0] = '\0';
        k._M_dataplus._M_p = (pointer)&k.field_2;
        piVar6 = std::operator>>((istream *)
                                 &((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                  _M_head_impl)->read_from,(string *)&k);
        this_00 = (void *)std::istream::operator>>(piVar6,&lower);
        plVar7 = (long *)std::istream::operator>>(this_00,&upper);
        if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
          pDVar8 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_60,__val);
          std::operator+(&local_a8,"lackey gave bad response triple ",&local_60);
          std::operator+(&local_88,&local_a8," to ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                         &local_88,&command);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &delete_one,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                         " query");
          DisobedientLackeyError::DisobedientLackeyError(pDVar8,(string *)&delete_one);
          __cxa_throw(pDVar8,&DisobedientLackeyError::typeinfo,
                      DisobedientLackeyError::~DisobedientLackeyError);
        }
        n_00._M_str = k._M_dataplus._M_p;
        n_00._M_len = k._M_string_length;
        p = InputGraph::vertex_from_name
                      (((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
                       pattern_graph,n_00);
        if (((ulong)p.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
          delete_one.p = &p;
          delete_one.restrict_range = local_68;
          delete_one.this = this;
          for (iVar9 = 1; v = upper, iVar9 < lower; iVar9 = iVar9 + 1) {
            reduce_initial_bounds::anon_class_24_3_091e47fb::operator()(&delete_one,iVar9);
          }
          while( true ) {
            v = v + 1;
            iVar9 = InputGraph::size(((this->_imp)._M_t.
                                      super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                      .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                     _M_head_impl)->target_graph);
            if (iVar9 <= v) break;
            reduce_initial_bounds::anon_class_24_3_091e47fb::operator()(&delete_one,v);
          }
        }
        std::__cxx11::string::~string((string *)&k);
      }
    }
    else {
      bVar4 = std::operator==(&response,"F");
      if (!bVar4) {
        pDVar8 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
        std::operator+(&local_60,"asked lackey to ",&command);
        std::operator+(&local_a8,&local_60," but it replied with \'");
        std::operator+(&local_88,&local_a8,&operation);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &local_88,"\' then \'");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &delete_one,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                       &response);
        std::operator+(&k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &delete_one,"\'");
        DisobedientLackeyError::DisobedientLackeyError(pDVar8,&k);
        __cxa_throw(pDVar8,&DisobedientLackeyError::typeinfo,
                    DisobedientLackeyError::~DisobedientLackeyError);
      }
    }
    std::__cxx11::string::~string((string *)&response);
    std::__cxx11::string::~string((string *)&operation);
    std::__cxx11::string::~string((string *)&command);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return bVar3;
  }
  pDVar8 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 "asked lackey to ",&command);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&delete_one,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 ", but it replied with \'");
  std::operator+(&k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&delete_one
                 ,&operation);
  std::operator+(&response,&k,"\'");
  DisobedientLackeyError::DisobedientLackeyError(pDVar8,&response);
  __cxa_throw(pDVar8,&DisobedientLackeyError::typeinfo,
              DisobedientLackeyError::~DisobedientLackeyError);
}

Assistant:

auto Lackey::reduce_initial_bounds(
    const RestrictRangeFunction & restrict_range) -> bool
{
    unique_lock<mutex> lock{_imp->external_solver_mutex};
    ++_imp->number_of_calls;

    string command = "I";
    _imp->send_to << command << " " << 0 << endl;

    if (! _imp->send_to)
        throw DisobedientLackeyError{"error giving lackey its orders"};

    string operation;
    if (! (_imp->read_from >> operation) || operation != command)
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it replied with '" + operation + "'"};

    string response;
    if (! (_imp->read_from >> response))
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it gave no T/F"};
    else if (response == "T") {
        /* nothing */
    }
    else if (response == "F")
        return false;
    else
        throw DisobedientLackeyError{"asked lackey to " + command + " but it replied with '" + operation + "' then '" + response + "'"};

    int n;
    if (! (_imp->read_from >> n))
        throw DisobedientLackeyError{"lackey replied with length '" + to_string(n) + "' to " + command + " query"};

    for (int i = 0; i < n; ++i) {
        string k;
        int lower, upper;
        if (! (_imp->read_from >> k >> lower >> upper))
            throw DisobedientLackeyError{"lackey gave bad response triple " + to_string(i) + " to " + command + " query"};
        auto p = _imp->pattern_graph.vertex_from_name(k);
        if (p) {
            auto delete_one = [&](int v) {
                auto v_name = _imp->target_graph.vertex_from_name(to_string(v));
                if (v_name)
                    restrict_range(*p, *v_name);
            };

            for (int i = 1; i < lower; ++i)
                delete_one(i);
            for (int i = upper + 1; i < _imp->target_graph.size(); ++i)
                delete_one(i);
        }
    }

    return true;
}